

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O3

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,btVector3 *svertices,uint stride,uint *vcount,
          btVector3 *vertices,btScalar normalepsilon,btVector3 *scale)

{
  float *pfVar1;
  int *ptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint i;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  btVector3 *pbVar8;
  btScalar *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar12;
  long lVar13;
  btScalar *pbVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  btScalar bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  btScalar bVar27;
  float fVar28;
  btScalar bVar29;
  btScalar bmax_1 [3];
  btScalar bmin_1 [3];
  btScalar bmax [3];
  btScalar bmin [3];
  undefined8 local_e8;
  float local_e0;
  float local_d8 [4];
  float local_c8 [4];
  float local_b8 [4];
  btScalar local_a8;
  btScalar *local_98;
  ulong local_90;
  btScalar local_88;
  btScalar bStack_84;
  btScalar bStack_80;
  btScalar bStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (svcount == 0) goto LAB_00127def;
  lVar13 = (long)(this->m_vertexIndexMapping).m_size;
  local_a8 = normalepsilon;
  if (lVar13 < 0) {
    piVar7 = (this->m_vertexIndexMapping).m_data;
    if ((this->m_vertexIndexMapping).m_capacity < 0) {
      if (piVar7 == (int *)0x0) {
        (this->m_vertexIndexMapping).m_ownsMemory = true;
      }
      else {
        if ((this->m_vertexIndexMapping).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar7);
        }
        (this->m_vertexIndexMapping).m_ownsMemory = true;
        (this->m_vertexIndexMapping).m_data = (int *)0x0;
      }
      (this->m_vertexIndexMapping).m_capacity = 0;
      piVar7 = (int *)0x0;
    }
    memset(piVar7 + lVar13,0,lVar13 * -4);
  }
  uVar5 = 0;
  (this->m_vertexIndexMapping).m_size = 0;
  *vcount = 0;
  scale->m_floats[0] = 1.0;
  scale->m_floats[1] = 1.0;
  scale->m_floats[2] = 1.0;
  local_b8[0] = 3.4028235e+38;
  local_b8[1] = 3.4028235e+38;
  local_b8[2] = 3.4028235e+38;
  local_c8[0] = -3.4028235e+38;
  local_c8[1] = -3.4028235e+38;
  local_c8[2] = -3.4028235e+38;
  uVar10 = (ulong)stride;
  pbVar8 = svertices;
  do {
    lVar13 = 0;
    do {
      fVar20 = pbVar8->m_floats[lVar13];
      if (fVar20 < local_b8[lVar13]) {
        local_b8[lVar13] = fVar20;
      }
      if (local_c8[lVar13] <= fVar20 && fVar20 != local_c8[lVar13]) {
        local_c8[lVar13] = fVar20;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    pbVar8 = (btVector3 *)((long)pbVar8->m_floats + uVar10);
    uVar5 = uVar5 + 1;
  } while (uVar5 != svcount);
  fVar20 = local_c8[2] - local_b8[2];
  local_48 = fVar20 * 0.5 + local_b8[2];
  fVar21 = (float)local_c8._0_8_ - (float)local_b8._0_8_;
  fVar22 = SUB84(local_c8._0_8_,4) - SUB84(local_b8._0_8_,4);
  local_68 = fVar21 * 0.5 + (float)local_b8._0_8_;
  local_58 = fVar22 * 0.5 + SUB84(local_b8._0_8_,4);
  uVar15 = -(uint)(fVar21 < 1e-06);
  uVar17 = -(uint)(fVar22 < 1e-06);
  if (svcount < 3) {
LAB_00127aaf:
    fVar25 = fVar21;
    if (3.4028235e+38 <= fVar21) {
      fVar25 = 3.4028235e+38;
    }
    fVar23 = (float)(~-(uint)(1e-06 < fVar21) & 0x7f7fffff | (uint)fVar25 & -(uint)(1e-06 < fVar21))
    ;
    fVar25 = fVar22;
    if (fVar23 <= fVar22) {
      fVar25 = fVar23;
    }
    fVar23 = (float)((uint)fVar25 & -(uint)(1e-06 < fVar22) |
                    ~-(uint)(1e-06 < fVar22) & (uint)fVar23);
    fVar25 = fVar20;
    if (fVar23 <= fVar20 || fVar20 <= 1e-06) {
      fVar25 = fVar23;
    }
    if ((fVar25 != 3.4028235e+38) || (NAN(fVar25))) {
      fVar25 = fVar25 * 0.05;
      uVar10 = CONCAT44(~uVar17 & (uint)fVar22,~uVar15 & (uint)fVar21) |
               CONCAT44((uint)fVar25 & uVar17,(uint)fVar25 & uVar15);
      if (1e-06 <= fVar20) {
        fVar25 = fVar20;
      }
    }
    else {
      uVar10 = 0x3c23d70a3c23d70a;
      fVar25 = 0.01;
    }
    fVar20 = local_68 - (float)uVar10;
    fVar23 = (float)(uVar10 >> 0x20);
    fVar21 = local_58 - fVar23;
    fVar22 = local_48 - fVar25;
    local_48 = local_48 + fVar25;
    *(ulong *)vertices->m_floats = CONCAT44(fVar21,fVar20);
    vertices->m_floats[2] = fVar22;
    vertices[1].m_floats[1] = fVar21;
    vertices[1].m_floats[2] = fVar22;
    local_68 = local_68 + (float)uVar10;
    local_58 = local_58 + fVar23;
    vertices[1].m_floats[0] = local_68;
    *(ulong *)vertices[2].m_floats = CONCAT44(local_58,local_68);
    vertices[2].m_floats[2] = fVar22;
    vertices[3].m_floats[0] = fVar20;
    vertices[3].m_floats[1] = local_58;
    vertices[3].m_floats[2] = fVar22;
    *(ulong *)vertices[4].m_floats = CONCAT44(fVar21,fVar20);
    vertices[4].m_floats[2] = local_48;
    vertices[5].m_floats[0] = local_68;
    vertices[5].m_floats[1] = fVar21;
    vertices[5].m_floats[2] = local_48;
    *(ulong *)vertices[6].m_floats = CONCAT44(local_58,local_68);
    vertices[6].m_floats[2] = local_48;
    vertices[7].m_floats[0] = fVar20;
    vertices[7].m_floats[1] = local_58;
    vertices[7].m_floats[2] = local_48;
  }
  else {
    auVar26._4_4_ = uVar15;
    auVar26._0_4_ = uVar15;
    auVar26._8_4_ = uVar17;
    auVar26._12_4_ = uVar17;
    uVar5 = movmskpd(uVar5,auVar26);
    if ((((uVar5 & 1) != 0) || ((byte)((byte)uVar5 >> 1) != 0)) || (fVar20 < 1e-06))
    goto LAB_00127aaf;
    *(ulong *)scale->m_floats = CONCAT44(fVar22,fVar21);
    scale->m_floats[2] = fVar20;
    auVar3._4_4_ = fVar22;
    auVar3._0_4_ = fVar21;
    auVar3._8_8_ = 0;
    auVar26 = divps(_DAT_001ee3f0,auVar3);
    local_68 = local_68 * auVar26._0_4_;
    local_58 = local_58 * auVar26._4_4_;
    local_48 = local_48 * (1.0 / fVar20);
    pbVar14 = vertices->m_floats + 2;
    uVar5 = 0;
    uVar11 = 3;
    bVar19 = local_a8;
    bVar27 = local_a8;
    bVar29 = local_a8;
    local_98 = pbVar14;
    local_90 = uVar10;
    local_88 = local_a8;
    bStack_84 = local_a8;
    bStack_80 = local_a8;
    bStack_7c = local_a8;
    local_78 = auVar26;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    do {
      fVar22 = (float)*(undefined8 *)svertices->m_floats * auVar26._0_4_;
      fVar25 = (float)((ulong)*(undefined8 *)svertices->m_floats >> 0x20) * auVar26._4_4_;
      fVar21 = svertices->m_floats[2] * (1.0 / fVar20);
      uVar15 = *vcount;
      uVar6 = (ulong)uVar15;
      uVar12 = 0;
      if (uVar6 == 0) {
LAB_001278ec:
        uVar17 = (uint)uVar12;
        if (uVar17 == uVar15) goto LAB_001278f0;
      }
      else {
        uVar12 = 0;
        pbVar9 = pbVar14;
        do {
          fVar23 = (float)*(undefined8 *)((btVector3 *)(pbVar9 + -2))->m_floats;
          fVar28 = (float)((ulong)*(undefined8 *)((btVector3 *)(pbVar9 + -2))->m_floats >> 0x20);
          iVar16 = -(uint)(ABS(fVar23 - fVar22) < bVar27);
          iVar18 = -(uint)(ABS(fVar28 - fVar25) < bVar29);
          auVar4._4_4_ = iVar16;
          auVar4._0_4_ = iVar16;
          auVar4._8_4_ = iVar18;
          auVar4._12_4_ = iVar18;
          uVar17 = movmskpd((int)uVar11,auVar4);
          uVar11 = (ulong)uVar17;
          if ((uVar17 == 3) && (ABS(*pbVar9 - fVar21) < bVar19)) {
            fVar24 = *pbVar9 - fStack_44;
            fVar23 = fVar23 - fStack_64;
            fVar28 = fVar28 - fStack_54;
            if (fVar24 * fVar24 + fVar23 * fVar23 + fVar28 * fVar28 <
                (fVar21 - local_48) * (fVar21 - local_48) +
                (fVar22 - local_68) * (fVar22 - local_68) +
                (fVar25 - local_58) * (fVar25 - local_58)) {
              *(ulong *)((btVector3 *)(pbVar9 + -2))->m_floats = CONCAT44(fVar25,fVar22);
              *pbVar9 = fVar21;
            }
            goto LAB_001278ec;
          }
          uVar12 = uVar12 + 1;
          pbVar9 = pbVar9 + 4;
          uVar17 = uVar15;
        } while (uVar6 != uVar12);
LAB_001278f0:
        *(ulong *)vertices[uVar6].m_floats = CONCAT44(fVar25,fVar22);
        vertices[uVar6].m_floats[2] = fVar21;
        *vcount = uVar15 + 1;
      }
      uVar15 = (this->m_vertexIndexMapping).m_size;
      if (uVar15 == (this->m_vertexIndexMapping).m_capacity) {
        iVar16 = uVar15 * 2;
        if (uVar15 == 0) {
          iVar16 = 1;
        }
        if ((int)uVar15 < iVar16) {
          if (iVar16 == 0) {
            piVar7 = (int *)0x0;
          }
          else {
            piVar7 = (int *)btAlignedAllocInternal((long)iVar16 << 2,0x10);
            uVar15 = (this->m_vertexIndexMapping).m_size;
            uVar11 = extraout_RDX;
            auVar26 = local_78;
            bVar19 = local_a8;
            bVar27 = local_88;
            bVar29 = bStack_84;
          }
          ptr = (this->m_vertexIndexMapping).m_data;
          if ((int)uVar15 < 1) {
            if (ptr != (int *)0x0) goto LAB_0012799e;
          }
          else {
            uVar10 = 0;
            do {
              uVar11 = (ulong)(uint)ptr[uVar10];
              piVar7[uVar10] = ptr[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar15 != uVar10);
LAB_0012799e:
            if ((this->m_vertexIndexMapping).m_ownsMemory == true) {
              btAlignedFreeInternal(ptr);
              uVar11 = extraout_RDX_00;
              auVar26 = local_78;
              bVar19 = local_a8;
              bVar27 = local_88;
              bVar29 = bStack_84;
            }
            uVar15 = (this->m_vertexIndexMapping).m_size;
          }
          (this->m_vertexIndexMapping).m_ownsMemory = true;
          (this->m_vertexIndexMapping).m_data = piVar7;
          (this->m_vertexIndexMapping).m_capacity = iVar16;
          uVar10 = local_90;
          pbVar14 = local_98;
        }
      }
      (this->m_vertexIndexMapping).m_data[(int)uVar15] = uVar17;
      piVar7 = &(this->m_vertexIndexMapping).m_size;
      *piVar7 = *piVar7 + 1;
      svertices = (btVector3 *)((long)svertices->m_floats + uVar10);
      uVar5 = uVar5 + 1;
    } while (uVar5 != svcount);
    local_d8[0] = 3.4028235e+38;
    local_d8[1] = 3.4028235e+38;
    local_d8[2] = 3.4028235e+38;
    local_e8 = 0xff7fffffff7fffff;
    local_e0 = -3.4028235e+38;
    uVar5 = *vcount;
    if ((ulong)uVar5 == 0) {
      fVar20 = 3.4028235e+38;
      fVar21 = 3.4028235e+38;
      local_e8 = 0xff7fffffff7fffff;
      local_e0 = -3.4028235e+38;
      local_d8[2] = 3.4028235e+38;
    }
    else {
      uVar10 = 0;
      pbVar8 = vertices;
      do {
        lVar13 = 0;
        do {
          fVar20 = pbVar8->m_floats[lVar13];
          if (fVar20 < local_d8[lVar13]) {
            local_d8[lVar13] = fVar20;
          }
          pfVar1 = (float *)((long)&local_e8 + lVar13 * 4);
          if (*pfVar1 <= fVar20 && fVar20 != *pfVar1) {
            *(float *)((long)&local_e8 + lVar13 * 4) = fVar20;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        uVar10 = uVar10 + 1;
        pbVar8 = pbVar8 + 1;
      } while (uVar10 != uVar5);
      fVar20 = (float)local_d8._0_8_;
      fVar21 = SUB84(local_d8._0_8_,4);
    }
    fVar22 = (float)local_e8 - fVar20;
    fVar25 = (float)((ulong)local_e8 >> 0x20) - fVar21;
    local_e0 = local_e0 - local_d8[2];
    uVar15 = -(uint)(fVar22 < 1e-06);
    uVar17 = -(uint)(fVar25 < 1e-06);
    if (2 < uVar5) {
      auVar2._4_4_ = uVar15;
      auVar2._0_4_ = uVar15;
      auVar2._8_4_ = uVar17;
      auVar2._12_4_ = uVar17;
      uVar5 = movmskpd(uVar5,auVar2);
      if ((((uVar5 & 1) == 0) && ((byte)((byte)uVar5 >> 1) == 0)) && (1e-06 <= local_e0))
      goto LAB_00127def;
    }
    fVar23 = fVar22;
    if (3.4028235e+38 <= fVar22) {
      fVar23 = 3.4028235e+38;
    }
    fVar28 = (float)(~-(uint)(1e-06 <= fVar22) & 0x7f7fffff |
                    (uint)fVar23 & -(uint)(1e-06 <= fVar22));
    fVar23 = fVar25;
    if (fVar28 <= fVar25) {
      fVar23 = fVar28;
    }
    fVar23 = (float)((uint)fVar23 & -(uint)(1e-06 <= fVar25) |
                    ~-(uint)(1e-06 <= fVar25) & (uint)fVar28);
    fVar28 = local_e0;
    if (fVar23 <= local_e0 || local_e0 < 1e-06) {
      fVar28 = fVar23;
    }
    fVar20 = fVar22 * 0.5 + fVar20;
    fVar21 = fVar25 * 0.5 + fVar21;
    local_d8[2] = local_e0 * 0.5 + local_d8[2];
    if ((fVar28 != 3.4028235e+38) || (NAN(fVar28))) {
      fVar28 = fVar28 * 0.05;
      uVar10 = CONCAT44(~uVar17 & (uint)fVar25,~uVar15 & (uint)fVar22) |
               CONCAT44((uint)fVar28 & uVar17,(uint)fVar28 & uVar15);
      if (1e-06 <= local_e0) {
        fVar28 = local_e0;
      }
    }
    else {
      uVar10 = 0x3c23d70a3c23d70a;
      fVar28 = 0.01;
    }
    fVar25 = fVar20 - (float)uVar10;
    fVar22 = (float)(uVar10 >> 0x20);
    fVar23 = fVar21 - fVar22;
    fVar24 = local_d8[2] - fVar28;
    local_d8[2] = local_d8[2] + fVar28;
    *(ulong *)vertices->m_floats = CONCAT44(fVar23,fVar25);
    vertices->m_floats[2] = fVar24;
    vertices[1].m_floats[1] = fVar23;
    vertices[1].m_floats[2] = fVar24;
    fVar20 = fVar20 + (float)uVar10;
    fVar21 = fVar21 + fVar22;
    vertices[1].m_floats[0] = fVar20;
    *(ulong *)vertices[2].m_floats = CONCAT44(fVar21,fVar20);
    vertices[2].m_floats[2] = fVar24;
    vertices[3].m_floats[0] = fVar25;
    vertices[3].m_floats[1] = fVar21;
    vertices[3].m_floats[2] = fVar24;
    *(ulong *)vertices[4].m_floats = CONCAT44(fVar23,fVar25);
    vertices[4].m_floats[2] = local_d8[2];
    vertices[5].m_floats[0] = fVar20;
    vertices[5].m_floats[1] = fVar23;
    vertices[5].m_floats[2] = local_d8[2];
    *(ulong *)vertices[6].m_floats = CONCAT44(fVar21,fVar20);
    vertices[6].m_floats[2] = local_d8[2];
    vertices[7].m_floats[0] = fVar25;
    vertices[7].m_floats[1] = fVar21;
    vertices[7].m_floats[2] = local_d8[2];
  }
  *vcount = 8;
LAB_00127def:
  return svcount != 0;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
				   const btVector3 *svertices,
				   unsigned int stride,
				   unsigned int &vcount,       // output number of vertices
				   btVector3 *vertices,                 // location to store the results.
				   btScalar  normalepsilon,
				   btVector3& scale)
{
	if ( svcount == 0 ) return false;

	m_vertexIndexMapping.resize(0);


#define EPSILON btScalar(0.000001) /* close enough to consider two btScalaring point numbers to be 'the same'. */

	vcount = 0;

	btScalar recip[3]={0.f,0.f,0.f};

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

//	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const btScalar *p = (const btScalar *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	btScalar dx = bmax[0] - bmin[0];
	btScalar dy = bmax[1] - bmin[1];
	btScalar dz = bmax[2] - bmin[2];

	btVector3 center;

	center[0] = dx*btScalar(0.5) + bmin[0];
	center[1] = dy*btScalar(0.5) + bmin[1];
	center[2] = dz*btScalar(0.5) + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		btScalar len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = btScalar(0.01); // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * btScalar(0.05);
			if ( dz < EPSILON ) dz = len * btScalar(0.05);
		}

		btScalar x1 = center[0] - dx;
		btScalar x2 = center[0] + dx;

		btScalar y1 = center[1] - dy;
		btScalar y2 = center[1] + dy;

		btScalar z1 = center[2] - dz;
		btScalar z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{
		const btVector3 *p = (const btVector3 *)vtx;
		vtx+=stride;

		btScalar px = p->getX();
		btScalar py = p->getY();
		btScalar pz = p->getZ();

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

//		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				/// XXX might be broken
				btVector3& v = vertices[j];

				btScalar x = v[0];
				btScalar y = v[1];
				btScalar z = v[2];

				btScalar dx = btFabs(x - px );
				btScalar dy = btFabs(y - py );
				btScalar dz = btFabs(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					btScalar dist1 = GetDist(px,py,pz,center);
					btScalar dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
						
					}

					break;
				}
			}

			if ( j == vcount )
			{
				btVector3& dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
//	if ( 1 )
	{
		btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const btVector3& p = vertices[i];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		btScalar dx = bmax[0] - bmin[0];
		btScalar dy = bmax[1] - bmin[1];
		btScalar dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			btScalar cx = dx*btScalar(0.5) + bmin[0];
			btScalar cy = dy*btScalar(0.5) + bmin[1];
			btScalar cz = dz*btScalar(0.5) + bmin[2];

			btScalar len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = btScalar(0.01); // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * btScalar(0.05);
				if ( dz < EPSILON ) dz = len * btScalar(0.05);
			}

			btScalar x1 = cx - dx;
			btScalar x2 = cx + dx;

			btScalar y1 = cy - dy;
			btScalar y2 = cy + dy;

			btScalar z1 = cz - dz;
			btScalar z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}